

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strcspn.c
# Opt level: O0

int main2(void)

{
  int iVar1;
  size_t sVar2;
  char c [4];
  char b [4];
  char a [12];
  
  _c = 0x6766653164636261;
  sVar2 = strcspn(c,"123");
  if (sVar2 == 4) {
    sVar2 = strcspn(c,"abc");
    if (sVar2 == 0) {
      sVar2 = strcspn(c,"890");
      if (sVar2 == 0xb) {
        a[4] = '\0';
        a[5] = '\0';
        a[6] = '\0';
        a[7] = '\0';
      }
      else {
        a[4] = '\x01';
        a[5] = '\0';
        a[6] = '\0';
        a[7] = '\0';
      }
    }
    else {
      a[4] = '\x01';
      a[5] = '\0';
      a[6] = '\0';
      a[7] = '\0';
    }
  }
  else {
    a[4] = '\x01';
    a[5] = '\0';
    a[6] = '\0';
    a[7] = '\0';
  }
  iVar1._0_1_ = a[4];
  iVar1._1_1_ = a[5];
  iVar1._2_1_ = a[6];
  iVar1._3_1_ = a[7];
  return iVar1;
}

Assistant:

int main2() {
    const char a[] = "abcd1efgh2i";
    const char b[] = "123";
    const char c[] = "890";

    ASSERT_INT_EQ(strcspn(a, "123"), 4);
    ASSERT_INT_EQ(strcspn(a, "abc"), 0);
    ASSERT_INT_EQ(strcspn(a, "890"), strlen(a));

    return 0;
}